

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjTable.hh
# Opt level: O2

void __thiscall ObjTable<Test>::resize(ObjTable<Test> *this,size_t a_size)

{
  iterator __position;
  size_t sVar1;
  
  std::vector<Test,_std::allocator<Test>_>::resize
            (&this->super_vector<Test,_std::allocator<Test>_>,a_size);
  if (this->min_sparse < a_size) {
    sVar1 = 0xffffffffffffffff;
    for (__position._M_node =
              (this->sparse_elements)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)__position._M_node !=
        &(this->sparse_elements)._M_t._M_impl.super__Rb_tree_header;
        __position = std::
                     _Rb_tree<unsigned_long,std::pair<unsigned_long_const,Test>,std::_Select1st<std::pair<unsigned_long_const,Test>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Test>>>
                     ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,Test>,std::_Select1st<std::pair<unsigned_long_const,Test>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Test>>>
                                         *)&this->sparse_elements,__position)) {
      if (a_size <= *(ulong *)(__position._M_node + 1)) {
        sVar1 = *(size_t *)(__position._M_node + 1);
        break;
      }
      (this->super_vector<Test,_std::allocator<Test>_>).
      super__Vector_base<Test,_std::allocator<Test>_>._M_impl.super__Vector_impl_data._M_start
      [*(ulong *)(__position._M_node + 1)].value = *(int *)&__position._M_node[1]._M_parent;
    }
    this->min_sparse = sVar1;
  }
  return;
}

Assistant:

void
    resize(size_t a_size)
    {
        std::vector<T>::resize(a_size);
        if (a_size > min_sparse) {
            auto it = sparse_elements.begin();
            auto end = sparse_elements.end();
            while (it != end && it->first < a_size) {
                std::vector<T>::operator[](it->first) = std::move(it->second);
                it = sparse_elements.erase(it);
            }
            min_sparse = (it == end) ? std::numeric_limits<size_t>::max() : it->first;
        }
    }